

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp-quicksort.cpp
# Opt level: O0

void lcpsort<false>(uchar **strings,Lcp *lcps,int lo,int hi)

{
  int iVar1;
  int local_30;
  int i;
  Lcp pivot;
  int gt;
  int lt;
  int hi_local;
  int lo_local;
  Lcp *lcps_local;
  uchar **strings_local;
  
  if (lo < hi) {
    iVar1 = lcps[lo];
    local_30 = lo + 1;
    i = hi;
    pivot = lo;
    while (local_30 <= i) {
      if (lcps[local_30] < iVar1) {
        exch(strings,lcps,local_30,i);
        i = i + -1;
      }
      else {
        if (iVar1 < lcps[local_30]) {
          exch(strings,lcps,pivot,local_30);
          pivot = pivot + 1;
        }
        local_30 = local_30 + 1;
      }
    }
    strsort(strings,lcps,pivot,i);
    lcpsort<false>(strings,lcps,lo,pivot + -1);
    lcpsort<false>(strings,lcps,i + 1,hi);
  }
  return;
}

Assistant:

void lcpsort( unsigned char * strings[], Lcp lcps[], int lo, int hi ) {
  if ( hi <= lo ) return;
  int lt = lo, gt = hi;

  Lcp pivot = lcps[lo];
  for( int i = lo + 1; i <= gt; ) {
    if      ( ascending ? lcps[i] > pivot : lcps[i] < pivot ) exch( strings, lcps, i, gt--);
    else if ( ascending ? lcps[i] < pivot : lcps[i] > pivot ) exch( strings, lcps, lt++, i++);
    else            i++;
  }

  strsort( strings, lcps, lt, gt );
  lcpsort<ascending>( strings, lcps, lo, lt-1 );
  lcpsort<ascending>( strings, lcps, gt+1, hi );
}